

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O3

bool AmpIO::WriteEncoderPreloadAll(BasePort *port,int32_t sdata)

{
  int iVar1;
  long *plVar2;
  bool bVar3;
  long lVar4;
  
  bVar3 = true;
  lVar4 = 0x14;
  do {
    if (0xffffff < sdata + 0x800000U) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"AmpIO::WriteEncoderPreloadAll, preload out of range ",0x34);
      plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cerr,sdata);
      std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
      std::ostream::put((char)plVar2);
      std::ostream::flush();
      return false;
    }
    if (port != (BasePort *)0x0) {
      iVar1 = (*port->_vptr_BasePort[0x24])(port,0x3f,lVar4,(ulong)(sdata + 0x800000U));
      bVar3 = (bool)(bVar3 & (byte)iVar1);
    }
    lVar4 = lVar4 + 0x10;
  } while (lVar4 != 0x94);
  return bVar3;
}

Assistant:

bool AmpIO::WriteEncoderPreloadAll(BasePort *port, int32_t sdata)
{
    bool ret = true;
    for (size_t index = 0; index < 8; ++index) {
        unsigned int channel = (index+1) << 4;

        if ((sdata >= ENC_MIDRANGE) || (sdata < -ENC_MIDRANGE)) {
            std::cerr << "AmpIO::WriteEncoderPreloadAll, preload out of range " << sdata << std::endl;
            return false;
        }
        // Cannot use NumEncoders below because this is a static method
        if (port && (index < MAX_CHANNELS)) {
            ret &= port->WriteQuadlet(FW_NODE_BROADCAST, channel | ENC_LOAD_REG,
                                      static_cast<uint32_t>(sdata + ENC_MIDRANGE));
        }
    }
    return ret;
}